

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
          (Deserializer *this,field_id_t field_id,char *tag,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret)

{
  uint uVar1;
  undefined6 in_register_00000032;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar1 == '\0') {
    local_40 = local_30;
    local_38 = 0;
    local_30[0] = 0;
  }
  else {
    (*this->_vptr_Deserializer[0x1a])(&local_40,this);
  }
  ::std::__cxx11::string::operator=((string *)ret,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar1 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}